

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

bool __thiscall Tokenizer::tryToGetString(Tokenizer *this)

{
  Mark MVar1;
  char cVar2;
  char cVar3;
  Mark *pMVar4;
  runtime_error *this_00;
  allocator<char> local_221;
  string local_220 [32];
  string local_200;
  Token local_1e0;
  stringstream ss;
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  pMVar4 = Stream::getMark(&this->stream_);
  MVar1 = *pMVar4;
  cVar2 = Stream::peek(&this->stream_);
  if (cVar2 == '\"') {
    Stream::advance(&this->stream_);
    while( true ) {
      cVar3 = Stream::peek(&this->stream_);
      if (cVar3 == '\"') break;
      cVar3 = Stream::peek(&this->stream_);
      if (cVar3 == -1) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_200,"Unexpected end of stream!",&local_221);
        makeErrorMessage((string *)&local_1e0,this,&local_200);
        std::runtime_error::runtime_error(this_00,(string *)&local_1e0);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cVar3 = Stream::peek(&this->stream_);
      if (cVar3 == '\\') {
        Stream::advance(&this->stream_);
        cVar3 = handleEscapeSequence(this);
      }
      else {
        cVar3 = Stream::peek(&this->stream_);
      }
      std::operator<<(local_198,cVar3);
      Stream::advance(&this->stream_);
    }
    Stream::advance(&this->stream_);
    std::__cxx11::stringbuf::str();
    local_1e0.type = String;
    std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
    _Variant_storage<0ul,std::__cxx11::string&>
              ((_Variant_storage<false,std::__cxx11::string,double> *)&local_1e0.value,local_220);
    local_1e0.mark = MVar1;
    Token::operator=(&this->token_,&local_1e0);
    std::__detail::__variant::
    _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                         *)&local_1e0.value);
    std::__cxx11::string::~string(local_220);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return cVar2 == '\"';
}

Assistant:

bool Tokenizer::tryToGetString()
{
  std::stringstream ss;
  const Mark mark = stream_.getMark();
  if(stream_.peek() == '\"')
  {
    stream_.advance();
    while(stream_.peek() != '\"')
    {
      if(stream_.peek() == EOF)
        throw std::runtime_error(makeErrorMessage("Unexpected end of stream!"));

      else if(stream_.peek() == '\\')
      {
        stream_.advance();
        ss << handleEscapeSequence();
      }
      else
        ss << (char)stream_.peek();
      stream_.advance();
    }
    stream_.advance();
  }
  else
    return false;

  token_ = Token{TokenType::String, ss.str(), mark};
  return true;
}